

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_2dPoint __thiscall
ON_PeriodicDomain::LiftToCover(ON_PeriodicDomain *this,ON_2dPoint Pin,bool stealth)

{
  double dVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  double dVar15;
  double in_XMM9_Qa;
  double dVar16;
  undefined8 in_XMM12_Qa;
  ON_2dPoint OVar17;
  undefined8 local_80;
  int local_78;
  int local_74;
  double local_70;
  undefined8 local_68;
  double local_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  
  dVar9 = Pin.y;
  dVar8 = Pin.x;
  lVar5 = 0;
  local_78 = 0;
  local_74 = 0;
  piVar6 = &local_78;
  local_60 = in_XMM9_Qa;
  local_70 = dVar8;
  local_58 = dVar9;
  dStack_50 = Pin.y;
  bVar4 = true;
  do {
    bVar3 = bVar4;
    dVar16 = dVar8;
    dVar15 = Pin.x;
    if (!bVar3) {
      dVar16 = dVar9;
      dVar15 = Pin.y;
    }
    local_48 = ZEXT816(0xffe5f8bd9e331dd2);
    if (ABS(dVar16) < 1.23432101234321e+308) {
      dVar1 = this->m_dom[lVar5].m_t[0];
      dVar11 = this->m_dom[lVar5].m_t[1];
      if ((dVar1 != dVar11) || (NAN(dVar1) || NAN(dVar11))) {
        auVar10._0_8_ = -(ulong)(dVar11 == dVar16) & 0x3ff0000000000000;
        auVar10._8_8_ = 0;
        auVar2._8_8_ = dVar15;
        auVar2._0_8_ = ~-(ulong)(dVar11 == dVar16) & (ulong)((dVar16 - dVar1) / (dVar11 - dVar1));
        local_48 = auVar10 | auVar2;
      }
      else {
        local_48 = ZEXT816(0);
      }
    }
    uVar12 = (undefined4)in_XMM12_Qa;
    uVar13 = (undefined4)((ulong)in_XMM12_Qa >> 0x20);
    dVar16 = local_48._0_8_;
    if (!bVar3) {
      uVar12 = local_48._0_4_;
      uVar13 = local_48._4_4_;
      dVar16 = local_60;
    }
    if (this->m_closed[lVar5] == true) {
      local_68 = in_XMM12_Qa;
      dVar9 = floor(local_48._0_8_);
      Pin.x = 0.0;
      *piVar6 = (int)dVar9;
      dVar16 = (double)local_48._0_8_ - (double)(int)dVar9;
      uVar12 = (undefined4)local_68;
      uVar13 = (undefined4)((ulong)local_68 >> 0x20);
      dVar8 = local_70;
      dVar15 = dVar16;
      dVar9 = local_58;
      Pin.y = dStack_50;
      if (!bVar3) break;
    }
    lVar5 = 1;
    dVar15 = (double)CONCAT44(uVar13,uVar12);
    in_XMM12_Qa = CONCAT44(uVar13,uVar12);
    piVar6 = &local_74;
    local_60 = dVar16;
    bVar4 = false;
  } while (bVar3);
  dVar16 = (this->m_nprev).x;
  if ((dVar16 == ON_2dPoint::UnsetPoint.x) && (!NAN(dVar16) && !NAN(ON_2dPoint::UnsetPoint.x))) {
    dVar16 = (this->m_nprev).y;
    if ((dVar16 == ON_2dPoint::UnsetPoint.y) && (!NAN(dVar16) && !NAN(ON_2dPoint::UnsetPoint.y))) {
      if (!stealth) {
        (this->m_nprev).x = local_60;
        (this->m_nprev).y = dVar15;
        *(ulong *)this->m_deck = CONCAT44(local_74,local_78);
      }
      goto LAB_00581709;
    }
  }
  local_80 = *(undefined8 *)this->m_deck;
  dVar9 = this->m_normband;
  lVar5 = 0;
  piVar6 = (int *)&local_80;
  bVar4 = true;
  do {
    bVar3 = bVar4;
    if (this->m_closed[lVar5] == true) {
      dVar16 = local_60;
      if (!bVar3) {
        dVar16 = dVar15;
      }
      if (((*(double *)(this->m_deck + (ulong)(byte)~bVar3 * 2 + 2) < dVar9) &&
          (iVar7 = -1, 1.0 - dVar9 < dVar16)) ||
         ((1.0 - dVar9 < *(double *)(this->m_deck + (ulong)(byte)~bVar3 * 2 + 2) &&
          (iVar7 = 1, dVar16 < dVar9)))) {
        *piVar6 = *piVar6 + iVar7;
      }
    }
    lVar5 = 1;
    piVar6 = (int *)((long)&local_80 + 4);
    bVar4 = false;
  } while (bVar3);
  lVar5 = 0;
  piVar6 = (int *)&local_80;
  dVar9 = dVar8;
  bVar4 = true;
  do {
    bVar3 = bVar4;
    dVar8 = dVar9;
    uVar12 = SUB84(local_60,0);
    uVar13 = (undefined4)((ulong)local_60 >> 0x20);
    if (!bVar3) {
      uVar12 = SUB84(dVar15,0);
      uVar13 = (undefined4)((ulong)dVar15 >> 0x20);
    }
    dVar11 = (double)*piVar6 + (double)CONCAT44(uVar13,uVar12);
    dVar16 = this->m_dom[lVar5].m_t[0];
    dVar1 = this->m_dom[lVar5].m_t[1];
    dVar9 = dVar11;
    if ((dVar16 == dVar1) && (!NAN(dVar16) && !NAN(dVar1))) {
      dVar9 = 0.0;
    }
    dVar14 = (1.0 - dVar9) * dVar16 + dVar1 * dVar9;
    dVar9 = (double)(~-(ulong)(ABS(dVar11) < 1.23432101234321e+308) & 0xffe5f8bd9e331dd2 |
                    -(ulong)(ABS(dVar11) < 1.23432101234321e+308) & (ulong)dVar14);
    if ((dVar16 == dVar1) && (!NAN(dVar16) && !NAN(dVar1))) {
      dVar9 = dVar14;
    }
    lVar5 = 1;
    piVar6 = (int *)((long)&local_80 + 4);
    bVar4 = false;
  } while (bVar3);
  if (!stealth) {
    *(undefined8 *)this->m_deck = local_80;
    (this->m_nprev).x = local_60;
    (this->m_nprev).y = dVar15;
  }
LAB_00581709:
  OVar17.y = dVar9;
  OVar17.x = dVar8;
  return OVar17;
}

Assistant:

ON_2dPoint ON_PeriodicDomain::LiftToCover(ON_2dPoint Pin, bool stealth )
{
	ON_2dPoint out = Pin;
	ON_2dPoint nnext;
	int deck_in[2] = { 0,0 };
	//  decompose Pin
	//     Pin = m_dom.ParameterAt( deck + nnext)
	// where nnext[i] is in [0.0, 1.0)
	for (int i = 0; i < 2; i++)
	{
		nnext[i] = m_dom[i].NormalizedParameterAt(out[i]);
		if (m_closed[i])
		{
			deck_in[i] = int(floor(nnext[i]));
			nnext[i] -= deck_in[i];
		}
	}


	if (m_nprev == ON_2dPoint::UnsetPoint)
	{
		if( !stealth)
		{ 
			m_nprev = nnext;
			m_deck[0] = deck_in[0];
			m_deck[1] = deck_in[1];
		}
		return Pin;
	}

	int deck[2] = { m_deck[0], m_deck[1] };
	for (int i = 0; i < 2; i++)
	{
		if (!m_closed[i])
			continue;
		if (m_nprev[i]<m_normband &&  nnext[i]>1.0 - m_normband)
			deck[i] --;
		else if (m_nprev[i] > 1.0 - m_normband && nnext[i] < m_normband)
			deck[i]++;
	}

	for (int i = 0; i < 2; i++)
		out[i] = m_dom[i].ParameterAt(deck[i] + nnext[i]);
	
	if (!stealth)
	{
		m_deck[0] = deck[0]; 
		m_deck[1] = deck[1];
		m_nprev = nnext;
	}

	return out;
}